

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

FiniteAutomaton *
Omega_h::FiniteAutomaton::unite
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *a,FiniteAutomaton *b)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = (a->table).ncols;
  bVar1 = a->is_deterministic;
  iVar3 = get_nrows<int>(&a->table);
  iVar4 = get_nrows<int>(&b->table);
  FiniteAutomaton(__return_storage_ptr__,iVar5 + (uint)bVar1 * 2 + -2,false,iVar3 + iVar4 + 1);
  iVar5 = add_state(__return_storage_ptr__);
  iVar3 = get_nrows<int>(&__return_storage_ptr__->table);
  append_states(__return_storage_ptr__,a);
  iVar4 = get_nrows<int>(&__return_storage_ptr__->table);
  append_states(__return_storage_ptr__,b);
  if (__return_storage_ptr__->is_deterministic != true) {
    iVar2 = (__return_storage_ptr__->table).ncols;
    add_transition(__return_storage_ptr__,iVar5,iVar2 + -2,iVar3);
    add_transition(__return_storage_ptr__,iVar5,iVar2 + -1,iVar4);
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","!fa.is_deterministic",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,0x1f);
}

Assistant:

FiniteAutomaton FiniteAutomaton::unite(
    FiniteAutomaton const& a, FiniteAutomaton const& b) {
  auto nsymbols = get_nsymbols(a);
  FiniteAutomaton out(nsymbols, false, 1 + get_nstates(a) + get_nstates(b));
  auto start_state = add_state(out);
  auto a_offset = get_nstates(out);
  append_states(out, a);
  auto b_offset = get_nstates(out);
  append_states(out, b);
  auto epsilon0 = get_epsilon0(out);
  auto epsilon1 = get_epsilon1(out);
  add_transition(out, start_state, epsilon0, a_offset);
  add_transition(out, start_state, epsilon1, b_offset);
  return out;
}